

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPrimal.cpp
# Opt level: O0

void __thiscall HPrimal::primalRebuild(HPrimal *this)

{
  bool bVar1;
  long in_RDI;
  HModel *this_00;
  double dVar2;
  double rebuildTime;
  bool reInvert;
  HModel *in_stack_00000010;
  int sv_invertHint;
  double tt0;
  HModel *in_stack_00000040;
  HModel *in_stack_00000080;
  HModel *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  uint phase;
  HModel *in_stack_fffffffffffffff0;
  
  HModel::recordPivots
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
             (double)in_stack_ffffffffffffffe0);
  this_00 = (HModel *)HTimer::getTime((HTimer *)in_stack_ffffffffffffffe0);
  phase = *(uint *)(in_RDI + 0x34);
  *(undefined4 *)(in_RDI + 0x34) = 0;
  bVar1 = 0 < *(int *)(*(long *)(in_RDI + 0x18) + 0x584);
  if ((*(byte *)(*(long *)(in_RDI + 0x18) + 0x574) & 1) == 0) {
    bVar1 = phase != 3 && bVar1;
  }
  if (bVar1) {
    HModel::computeFactor(in_stack_00000010);
    *(undefined4 *)(in_RDI + 0x30) = 0;
  }
  HModel::computeDual(in_stack_00000080);
  HModel::computePrimal(in_stack_00000040);
  HModel::computeDuObj(this_00,phase);
  HModel::util_reportNumberIterationObjectiveValue(in_stack_ffffffffffffffe0);
  dVar2 = HTimer::getTime((HTimer *)in_stack_ffffffffffffffe0);
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
  *(double *)(in_RDI + 0x10) = (dVar2 - (double)this_00) + *(double *)(in_RDI + 0x10);
  printf("Primal     rebuild %d (%1d) on iteration %9d: Rebuild time = %g; Total rebuild time %g\n",
         dVar2 - (double)this_00,*(undefined8 *)(in_RDI + 0x10),(ulong)*(uint *)(in_RDI + 8),
         (ulong)phase,(ulong)*(uint *)(*(long *)(in_RDI + 0x18) + 0x588));
  *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x604) = 1;
  return;
}

Assistant:

void HPrimal::primalRebuild() {
    model->recordPivots(-1, -1, 0); // Indicate REINVERT
#ifdef JAJH_dev
    //    double tt0 = model->timer.getTime();
#endif
    double tt0 = model->timer.getTime();

    // Rebuild model->factor - only if we got updates
    int sv_invertHint = invertHint;
    invertHint = invertHint_no; // Was 0
    // Possibly Rebuild model->factor
    bool reInvert = model->countUpdate > 0;
    if (!model->InvertIfRowOutNeg) {
      // Don't reinvert if rowOut is negative [equivalently, if sv_invertHint == invertHint_possiblyOptimal]
      if (sv_invertHint == invertHint_possiblyOptimal) {
	assert(columnIn == -1);
	reInvert = false;
      }
    }
    if (reInvert) {
        model->computeFactor();
        countUpdate = 0;
    }
    model->computeDual();
    model->computePrimal();
    model->computeDuObj();
    model->util_reportNumberIterationObjectiveValue();

    double rebuildTime = model->timer.getTime()-tt0;
    totalRebuilds++;
    totalRebuildTime += rebuildTime;
#ifdef JAJH_dev
    printf("Primal     rebuild %d (%1d) on iteration %9d: Rebuild time = %g; Total rebuild time %g\n",
	   totalRebuilds, sv_invertHint, model->numberIteration, rebuildTime, totalRebuildTime);
#endif
    //Data are fresh from rebuild
    model->mlFg_haveFreshRebuild = 1;
}